

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnEnabled(int column_n,bool enabled)

{
  ImGuiTable *pIVar1;
  bool bVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiContext *g;
  bool enabled_local;
  int column_n_local;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0x609,"void ImGui::TableSetColumnEnabled(int, bool)");
  }
  if (pIVar1 != (ImGuiTable *)0x0) {
    if ((pIVar1->Flags & 4U) == 0) {
      __assert_fail("table->Flags & ImGuiTableFlags_Hideable",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                    ,0x60c,"void ImGui::TableSetColumnEnabled(int, bool)");
    }
    g._4_4_ = column_n;
    if (column_n < 0) {
      g._4_4_ = pIVar1->CurrentColumn;
    }
    bVar2 = false;
    if (-1 < g._4_4_) {
      bVar2 = g._4_4_ < pIVar1->ColumnsCount;
    }
    if (!bVar2) {
      __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                    ,0x60f,"void ImGui::TableSetColumnEnabled(int, bool)");
    }
    pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,g._4_4_);
    pIVar3->IsUserEnabledNextFrame = enabled;
  }
  return;
}

Assistant:

void ImGui::TableSetColumnEnabled(int column_n, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL);
    if (!table)
        return;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Hideable); // See comments above
    if (column_n < 0)
        column_n = table->CurrentColumn;
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column = &table->Columns[column_n];
    column->IsUserEnabledNextFrame = enabled;
}